

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

shared_ptr<dap::ReaderWriter> __thiscall dap::file(dap *this,FILE *f,bool closable)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::ReaderWriter> sVar2;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::File,_std::allocator<(anonymous_namespace)::File>,_(__gnu_cxx::_Lock_policy)2>_>
  local_51;
  undefined8 local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::File,_std::allocator<(anonymous_namespace)::File>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  puVar1 = (undefined8 *)operator_new(0x88);
  local_40._M_alloc = &local_51;
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00a23fa0;
  anon_unknown.dwarf_23c3742::File::File((File *)(puVar1 + 2),f,closable);
  local_40._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::File,_std::allocator<(anonymous_namespace)::File>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  *(File **)this = (File *)(puVar1 + 2);
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 **)(this + 8) = puVar1;
  local_50 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> file(FILE* f, bool closable /* = true */) {
  return std::make_shared<File>(f, closable);
}